

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GreaterEqualLayerParams::GreaterEqualLayerParams
          (GreaterEqualLayerParams *this,GreaterEqualLayerParams *from)

{
  GreaterEqualLayerParams *from_local;
  GreaterEqualLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GreaterEqualLayerParams_006f3398
  ;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->alpha_ = from->alpha_;
  return;
}

Assistant:

GreaterEqualLayerParams::GreaterEqualLayerParams(const GreaterEqualLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  alpha_ = from.alpha_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.GreaterEqualLayerParams)
}